

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer_allocator.cpp
# Opt level: O3

void __thiscall duckdb::UndoBufferEntry::~UndoBufferEntry(UndoBufferEntry *this)

{
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> this_01;
  pointer pUVar2;
  bool bVar3;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> local_20;
  
  _Var1._M_head_impl =
       (this->next).
       super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
       .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (UndoBufferEntry *)0x0) {
    (this->next).
    super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t.
    super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
    .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl = (UndoBufferEntry *)0x0;
    local_20._M_head_impl = _Var1._M_head_impl;
    do {
      pUVar2 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
               ::operator->((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
                             *)&local_20);
      this_01._M_head_impl = local_20._M_head_impl;
      _Var1._M_head_impl =
           (pUVar2->next).
           super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
           .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
      (pUVar2->next).
      super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t.
      super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
      .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl = (UndoBufferEntry *)0x0
      ;
      bVar3 = local_20._M_head_impl != (UndoBufferEntry *)0x0;
      local_20._M_head_impl = _Var1._M_head_impl;
      if (bVar3) {
        ~UndoBufferEntry(this_01._M_head_impl);
        operator_delete(this_01._M_head_impl);
      }
    } while (local_20._M_head_impl != (UndoBufferEntry *)0x0);
    _Var1._M_head_impl =
         (this->next).
         super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
         .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (UndoBufferEntry *)0x0) {
      ~UndoBufferEntry(_Var1._M_head_impl);
      operator_delete(_Var1._M_head_impl);
    }
  }
  (this->next).
  super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t.
  super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>.
  super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl = (UndoBufferEntry *)0x0;
  this_00 = (this->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

UndoBufferEntry::~UndoBufferEntry() {
	if (next) {
		auto current_next = std::move(next);
		while (current_next) {
			current_next = std::move(current_next->next);
		}
	}
}